

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_primary_expression(xpath_parser *this)

{
  ulong uVar1;
  bool bVar2;
  lexeme_t lVar3;
  xpath_lexer_string *pxVar4;
  xpath_ast_node *pxVar5;
  xpath_variable *value_00;
  xpath_parser *in_RDI;
  xpath_ast_node *n_1;
  size_t old_depth;
  xpath_ast_node *last_arg;
  xpath_lexer_string function;
  size_t argc;
  xpath_ast_node *args [2];
  double value_1;
  char_t *value;
  xpath_ast_node *n;
  xpath_variable *var;
  xpath_lexer_string name;
  char *in_stack_ffffffffffffff58;
  xpath_parser *in_stack_ffffffffffffff60;
  double *out_result;
  xpath_parser *in_stack_ffffffffffffff78;
  xpath_parser *in_stack_ffffffffffffff80;
  size_t sVar6;
  char_t (*in_stack_ffffffffffffff88) [32];
  xpath_parser *this_00;
  ulong local_60;
  char_t *local_58 [5];
  xpath_ast_node *local_30;
  xpath_variable *local_28;
  char_t *local_20;
  char_t *local_18;
  xpath_ast_node *local_8;
  
  lVar3 = xpath_lexer::current(&in_RDI->_lexer);
  value_00 = (xpath_variable *)(ulong)(lVar3 - lex_var_ref);
  switch(value_00) {
  case (xpath_variable *)0x0:
    pxVar4 = xpath_lexer::contents(&in_RDI->_lexer);
    local_20 = pxVar4->begin;
    local_18 = pxVar4->end;
    if (in_RDI->_variables == (xpath_variable_set *)0x0) {
      local_8 = error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      local_28 = (xpath_variable *)0x0;
      bVar2 = get_variable_scratch
                        (in_stack_ffffffffffffff88,(xpath_variable_set *)in_stack_ffffffffffffff80,
                         (char_t *)in_stack_ffffffffffffff78,(char_t *)value_00,
                         (xpath_variable **)in_RDI);
      if (bVar2) {
        if (local_28 == (xpath_variable *)0x0) {
          local_8 = error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          xpath_lexer::next(&in_RDI->_lexer);
          xpath_variable::type(local_28);
          local_8 = alloc_node(in_stack_ffffffffffffff80,
                               (ast_type_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                               (xpath_value_type)in_stack_ffffffffffffff78,value_00);
        }
      }
      else {
        local_8 = error_oom(in_RDI);
      }
    }
    break;
  case (xpath_variable *)0x1:
    xpath_lexer::next(&in_RDI->_lexer);
    local_30 = parse_expression(in_stack_ffffffffffffff78,(int)((ulong)value_00 >> 0x20));
    if (local_30 == (xpath_ast_node *)0x0) {
      local_8 = (xpath_ast_node *)0x0;
    }
    else {
      lVar3 = xpath_lexer::current(&in_RDI->_lexer);
      if (lVar3 == lex_close_brace) {
        xpath_lexer::next(&in_RDI->_lexer);
        local_8 = local_30;
      }
      else {
        local_8 = error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
    }
    break;
  default:
    local_8 = error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    break;
  case (xpath_variable *)0x3:
    xpath_lexer::contents(&in_RDI->_lexer);
    local_58[4] = alloc_string(in_stack_ffffffffffffff78,(xpath_lexer_string *)value_00);
    if (local_58[4] == (char_t *)0x0) {
      local_8 = (xpath_ast_node *)0x0;
    }
    else {
      xpath_lexer::next(&in_RDI->_lexer);
      local_8 = alloc_node(in_stack_ffffffffffffff80,
                           (ast_type_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                           (xpath_value_type)in_stack_ffffffffffffff78,(char_t *)value_00);
    }
    break;
  case (xpath_variable *)0x4:
    local_58[3] = (char_t *)0x0;
    pxVar4 = xpath_lexer::contents(&in_RDI->_lexer);
    out_result = (double *)pxVar4->begin;
    xpath_lexer::contents(&in_RDI->_lexer);
    bVar2 = convert_string_to_number_scratch
                      ((char_t (*) [32])in_stack_ffffffffffffff78,(char_t *)value_00,
                       (char_t *)in_RDI,out_result);
    if (bVar2) {
      xpath_lexer::next(&in_RDI->_lexer);
      local_8 = alloc_node(in_stack_ffffffffffffff80,
                           (ast_type_t)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                           (xpath_value_type)in_stack_ffffffffffffff78,(double)value_00);
    }
    else {
      local_8 = error_oom(in_RDI);
    }
    break;
  case (xpath_variable *)0x9:
    memset(local_58,0,0x10);
    local_60 = 0;
    xpath_lexer::contents(&in_RDI->_lexer);
    xpath_lexer::next(&in_RDI->_lexer);
    this_00 = (xpath_parser *)0x0;
    lVar3 = xpath_lexer::current(&in_RDI->_lexer);
    if (lVar3 == lex_open_brace) {
      xpath_lexer::next(&in_RDI->_lexer);
      sVar6 = in_RDI->_depth;
      while (lVar3 = xpath_lexer::current(&in_RDI->_lexer), lVar3 != lex_close_brace) {
        if (local_60 != 0) {
          lVar3 = xpath_lexer::current(&in_RDI->_lexer);
          if (lVar3 != lex_comma) {
            pxVar5 = error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            return pxVar5;
          }
          xpath_lexer::next(&in_RDI->_lexer);
        }
        uVar1 = in_RDI->_depth + 1;
        in_RDI->_depth = uVar1;
        if (0x400 < uVar1) {
          pxVar5 = error_rec((xpath_parser *)0x1f4ad0);
          return pxVar5;
        }
        in_stack_ffffffffffffff78 =
             (xpath_parser *)
             parse_expression(in_stack_ffffffffffffff78,(int)((ulong)value_00 >> 0x20));
        if (in_stack_ffffffffffffff78 == (xpath_parser *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        if (local_60 < 2) {
          local_58[local_60] = (char_t *)in_stack_ffffffffffffff78;
        }
        else {
          xpath_ast_node::set_next
                    ((xpath_ast_node *)this_00,(xpath_ast_node *)in_stack_ffffffffffffff78);
        }
        local_60 = local_60 + 1;
        this_00 = in_stack_ffffffffffffff78;
      }
      xpath_lexer::next(&in_RDI->_lexer);
      in_RDI->_depth = sVar6;
      local_8 = parse_function(in_stack_ffffffffffffff78,(xpath_lexer_string *)value_00,
                               (size_t)in_RDI,(xpath_ast_node **)in_stack_ffffffffffffff60);
    }
    else {
      local_8 = error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  return local_8;
}

Assistant:

xpath_ast_node* parse_primary_expression()
		{
			switch (_lexer.current())
			{
			case lex_var_ref:
			{
				xpath_lexer_string name = _lexer.contents();

				if (!_variables)
					return error("Unknown variable: variable set is not provided");

				xpath_variable* var = NULL;
				if (!get_variable_scratch(_scratch, _variables, name.begin, name.end, &var))
					return error_oom();

				if (!var)
					return error("Unknown variable: variable set does not contain the given name");

				_lexer.next();

				return alloc_node(ast_variable, var->type(), var);
			}

			case lex_open_brace:
			{
				_lexer.next();

				xpath_ast_node* n = parse_expression();
				if (!n) return NULL;

				if (_lexer.current() != lex_close_brace)
					return error("Expected ')' to match an opening '('");

				_lexer.next();

				return n;
			}

			case lex_quoted_string:
			{
				const char_t* value = alloc_string(_lexer.contents());
				if (!value) return NULL;

				_lexer.next();

				return alloc_node(ast_string_constant, xpath_type_string, value);
			}

			case lex_number:
			{
				double value = 0;

				if (!convert_string_to_number_scratch(_scratch, _lexer.contents().begin, _lexer.contents().end, &value))
					return error_oom();

				_lexer.next();

				return alloc_node(ast_number_constant, xpath_type_number, value);
			}

			case lex_string:
			{
				xpath_ast_node* args[2] = {NULL};
				size_t argc = 0;

				xpath_lexer_string function = _lexer.contents();
				_lexer.next();

				xpath_ast_node* last_arg = NULL;

				if (_lexer.current() != lex_open_brace)
					return error("Unrecognized function call");
				_lexer.next();

				size_t old_depth = _depth;

				while (_lexer.current() != lex_close_brace)
				{
					if (argc > 0)
					{
						if (_lexer.current() != lex_comma)
							return error("No comma between function arguments");
						_lexer.next();
					}

					if (++_depth > xpath_ast_depth_limit)
						return error_rec();

					xpath_ast_node* n = parse_expression();
					if (!n) return NULL;

					if (argc < 2) args[argc] = n;
					else last_arg->set_next(n);

					argc++;
					last_arg = n;
				}

				_lexer.next();

				_depth = old_depth;

				return parse_function(function, argc, args);
			}

			default:
				return error("Unrecognizable primary expression");
			}
		}